

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void units::addUnitPower(string *str,char *unit,int power,uint64_t flags)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  long lVar4;
  char cVar5;
  string local_50;
  byte local_29;
  uint64_t uStack_28;
  bool div;
  uint64_t flags_local;
  char *pcStack_18;
  int power_local;
  char *unit_local;
  string *str_local;
  
  local_29 = 0;
  if (power != 0) {
    uStack_28 = flags;
    flags_local._4_4_ = power;
    pcStack_18 = unit;
    unit_local = (char *)str;
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      pcVar3 = (char *)std::__cxx11::string::back();
      if (*pcVar3 == '/') {
        local_29 = 1;
      }
      else {
        pcVar3 = (char *)std::__cxx11::string::back();
        if (*pcVar3 != '*') {
          std::__cxx11::string::push_back((char)unit_local);
        }
      }
    }
    std::__cxx11::string::append(unit_local);
    if (flags_local._4_4_ != 1) {
      std::__cxx11::string::push_back((char)unit_local);
      lVar4 = (long)flags_local._4_4_;
      if (lVar4 < 1) {
        lVar4 = -lVar4;
      }
      if (lVar4 < 10) {
        if (flags_local._4_4_ < 0) {
          std::__cxx11::string::push_back((char)unit_local);
          std::__cxx11::string::push_back((char)unit_local);
        }
        else {
          std::__cxx11::string::push_back((char)unit_local);
        }
      }
      else {
        bVar1 = allowLargePowers(uStack_28);
        cVar5 = (char)unit_local;
        if (bVar1) {
          std::__cxx11::string::push_back(cVar5);
          pcVar3 = unit_local;
          std::__cxx11::to_string(&local_50,flags_local._4_4_);
          std::__cxx11::string::append((string *)pcVar3);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::push_back((char)unit_local);
        }
        else {
          if (flags_local._4_4_ < 0) {
            std::__cxx11::string::push_back(cVar5);
            std::__cxx11::string::push_back((char)unit_local);
            flags_local._4_4_ = flags_local._4_4_ + 9;
          }
          else {
            std::__cxx11::string::push_back(cVar5);
            flags_local._4_4_ = flags_local._4_4_ + -9;
          }
          if ((local_29 & 1) != 0) {
            std::__cxx11::string::push_back((char)unit_local);
          }
          addUnitPower((string *)unit_local,pcStack_18,flags_local._4_4_,uStack_28);
        }
      }
    }
  }
  return;
}

Assistant:

static void addUnitPower(
    std::string& str,
    const char* unit,
    int power,
    std::uint64_t flags)
{
    bool div{false};
    if (power != 0) {
        if (!str.empty()) {
            if (str.back() != '/') {
                if (str.back() != '*') {
                    str.push_back('*');
                }
            } else {
                div = true;
            }
        }

        str.append(unit);
        if (power != 1) {
            str.push_back('^');
            if (std::labs(power) < 10) {
                if (power < 0) {
                    str.push_back('-');
                    str.push_back('0' - power);
                } else {
                    str.push_back('0' + power);
                }
            } else {
                if (allowLargePowers(flags)) {
                    str.push_back('(');
                    str.append(std::to_string(power));
                    str.push_back(')');
                } else {
                    if (power < 0) {
                        str.push_back('-');
                        str.push_back('9');
                        power += 9;
                    } else {
                        str.push_back('9');
                        power -= 9;
                    }
                    if (div) {
                        str.push_back('/');
                    }
                    addUnitPower(str, unit, power, flags);
                }
            }
        }
    }
}